

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cpp
# Opt level: O3

bool __thiscall
Filesystem::make_dir
          (Filesystem *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  iterator __position;
  pointer pcVar1;
  char *__s2;
  Fcb fcb;
  bool bVar2;
  int iVar3;
  Document *this_00;
  pointer pbVar4;
  int i;
  long lVar5;
  ulong uVar6;
  pointer __s1;
  iterator it;
  string needtoMake;
  Fcb newFcb;
  int local_9c;
  long *local_98 [2];
  long local_88 [2];
  ulong local_78;
  undefined1 local_70 [16];
  pointer local_60;
  unsigned_long uStack_58;
  char local_50;
  undefined7 uStack_4f;
  vector<Fcb,_std::allocator<Fcb>_> local_48;
  
  __position._M_current =
       (paths->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  if ((__position._M_current !=
       (paths->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish) &&
     (iVar3 = std::__cxx11::string::compare((char *)__position._M_current), iVar3 == 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(paths,__position);
  }
  this_00 = (Document *)operator_new(0x20);
  Document::Document(this_00,this->proot);
  pbVar4 = (paths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_98[0] = local_88;
  pcVar1 = pbVar4[-1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,pcVar1,pcVar1 + pbVar4[-1]._M_string_length);
  pbVar4 = (paths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(paths->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 == 0x20) {
    local_9c = 5;
  }
  else {
    uVar6 = 0;
    do {
      __s1 = (this_00->fcbList).super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.
             super__Vector_impl_data._M_start;
      lVar5 = (long)(this_00->fcbList).super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)__s1;
      if (lVar5 == 0) {
        bVar2 = false;
        goto LAB_0010732e;
      }
      lVar5 = (lVar5 >> 3) * -0x3333333333333333;
      __s2 = pbVar4[uVar6]._M_dataplus._M_p;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      local_78 = uVar6;
      while ((iVar3 = strcmp(__s1->filename,__s2), iVar3 != 0 || (__s1->attribute != '\0'))) {
        __s1 = __s1 + 1;
        lVar5 = lVar5 + -1;
        if (lVar5 == 0) {
          bVar2 = false;
          goto LAB_0010732e;
        }
      }
      local_9c = __s1->first;
      if (this_00->pos != this->proot->pos) {
        Document::~Document(this_00);
        operator_delete(this_00,0x20);
      }
      copy_file_vec((vector<Fcb,_std::allocator<Fcb>_> *)local_70,this,local_9c);
      this_00 = (Document *)operator_new(0x20);
      std::vector<Fcb,_std::allocator<Fcb>_>::vector
                (&local_48,(vector<Fcb,_std::allocator<Fcb>_> *)local_70);
      std::vector<Fcb,_std::allocator<Fcb>_>::vector
                ((vector<Fcb,_std::allocator<Fcb>_> *)this_00,&local_48);
      this_00->pos = (char *)0x0;
      if (local_48.super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<Fcb,_std::allocator<Fcb>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((char  [8])local_70._0_8_ != (char  [8])0x0) {
        operator_delete((void *)local_70._0_8_,(long)local_60 - local_70._0_8_);
      }
      uVar6 = local_78 + 1;
      pbVar4 = (paths->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < ((long)(paths->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) - 1U);
  }
  Document::save(this_00);
  if (this_00->pos != this->proot->pos) {
    Document::~Document(this_00);
    operator_delete(this_00,0x20);
  }
  lVar5 = 6;
  do {
    if (this->pfat1->filelist[lVar5] == 0) goto LAB_0010712b;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 1000);
  lVar5 = 0xffffffff;
LAB_0010712b:
  this->pfat1->filelist[(int)lVar5] = 0xffff;
  initFcb((Fcb *)local_70,(char *)local_98[0],"",'\0',0,0,(int)lVar5,0,'\x01');
  fcb.exname[0] = local_70[8];
  fcb.exname[1] = local_70[9];
  fcb.exname[2] = local_70[10];
  fcb.attribute = local_70[0xb];
  fcb.time = local_70._12_2_;
  fcb.date = local_70._14_2_;
  fcb.filename[0] = local_70[0];
  fcb.filename[1] = local_70[1];
  fcb.filename[2] = local_70[2];
  fcb.filename[3] = local_70[3];
  fcb.filename[4] = local_70[4];
  fcb.filename[5] = local_70[5];
  fcb.filename[6] = local_70[6];
  fcb.filename[7] = local_70[7];
  fcb.first = (int)local_60;
  fcb._20_4_ = (int)((ulong)local_60 >> 0x20);
  fcb.length = uStack_58;
  fcb.free = local_50;
  fcb._33_7_ = uStack_4f;
  bVar2 = add_fcb(this,local_9c,fcb);
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[Err]Cannot make this fold!",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
  }
LAB_0010732e:
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  return bVar2;
}

Assistant:

bool Filesystem::make_dir(vector<string> paths)
{

    if (!paths.empty())
    {
        auto it = paths.begin();
        if (*it == "")
            paths.erase(it);
    }


    Document *curDir = new Document(*proot);
    Fcb curFcb;
    bool findFlag = false;
    int blockId = 5;

   blockId = 5;


    string needtoMake = paths.back();

    for(int j=0;j<paths.size()-1;j++)
    {
        // search curDir
        for (int i = 0; i < curDir->fcbList.size(); ++i)
        {
            if (strcmp(curDir->fcbList[i].filename,paths[j].c_str()) ==0)
            {
                if (curDir->fcbList[i].attribute==0)
                {
                    findFlag = true;
                    curFcb = curDir->fcbList[i];
                    blockId = curFcb.first;
                    break;
                }

            }
        }
        if (!findFlag)
        {
            return false;
        }
        else
        {
            if (curDir->pos != proot->pos)
                delete curDir;
            auto vec = copy_file_vec(blockId);

            curDir = new Document(vec);
            findFlag = false;
        }
    }

    curDir->save();
    if (curDir->pos!=proot->pos)
        delete curDir;

    /// create the file in curDir
    Fcb newFcb;
    //allocate new block
    int newBlock = pfat1->get_FreeBlock();
    (*pfat1)[newBlock] = END;
    initFcb(newFcb,needtoMake.c_str(),"",0,0,0,newBlock,0,1);
    if(!add_fcb(blockId,newFcb))
    {
        cout << "[Err]Cannot make this fold!"<<endl;
        return false;
    }



    return true;

}